

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::TypeBuilder::setHeapType(TypeBuilder *this,size_t i,Continuation continuation)

{
  size_t sVar1;
  pointer pIVar2;
  reference this_00;
  HeapTypeInfo local_70;
  size_t local_20;
  size_t i_local;
  TypeBuilder *this_local;
  Continuation continuation_local;
  
  local_20 = i;
  i_local = (size_t)this;
  this_local = (TypeBuilder *)continuation.type.id;
  sVar1 = size(this);
  if (sVar1 <= i) {
    __assert_fail("i < size() && \"index out of bounds\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                  ,0x8ff,"void wasm::TypeBuilder::setHeapType(size_t, Continuation)");
  }
  pIVar2 = std::unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>::
           operator->(&this->impl);
  this_00 = std::
            vector<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
            ::operator[](&pIVar2->entries,local_20);
  anon_unknown_0::HeapTypeInfo::HeapTypeInfo(&local_70,(Continuation)this_local);
  Impl::Entry::set(this_00,&local_70);
  anon_unknown_0::HeapTypeInfo::~HeapTypeInfo(&local_70);
  return;
}

Assistant:

void TypeBuilder::setHeapType(size_t i, Continuation continuation) {
  assert(i < size() && "index out of bounds");
  impl->entries[i].set(continuation);
}